

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  if (size == 0) {
    pNVar2 = &dummynode_;
    t->node = &dummynode_;
    iVar6 = 0;
    lVar3 = 0;
    goto LAB_0011393b;
  }
  iVar1 = luaO_log2(size - 1);
  iVar6 = iVar1 + 1;
  if (iVar1 < 0x1a) {
LAB_001138d4:
    uVar5 = 1 << ((byte)iVar6 & 0x1f);
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,(long)(int)uVar5 * 0x28);
  }
  else {
    luaG_runerror(L,"table overflow");
    if (iVar6 != 0x1f) goto LAB_001138d4;
    pNVar2 = (Node *)luaM_toobig(L);
    uVar5 = 0x80000000;
  }
  t->node = pNVar2;
  lVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  for (; uVar4 * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
    pNVar2 = t->node;
    *(undefined8 *)((long)&pNVar2->i_key + lVar3 + 0x10) = 0;
    *(undefined4 *)((long)&pNVar2->i_key + lVar3 + 8) = 0;
    *(undefined4 *)((long)&(pNVar2->i_val).tt + lVar3) = 0;
  }
  lVar3 = (long)(int)uVar5;
  pNVar2 = t->node;
LAB_0011393b:
  t->lsizenode = (lu_byte)iVar6;
  t->lastfree = pNVar2 + lVar3;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, int size) {
  int lsize;
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common `dummynode' */
    lsize = 0;
  }
  else {
    int i;
    lsize = ceillog2(size);
    if (lsize > MAXBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i=0; i<size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = NULL;
      setnilvalue(gkey(n));
      setnilvalue(gval(n));
    }
  }
  t->lsizenode = cast_byte(lsize);
  t->lastfree = gnode(t, size);  /* all positions are free */
}